

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::UnaryUpdate<duckdb::MinMaxState<double>,double,duckdb::MinOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  UnifiedVectorFormat idata;
  AggregateUnaryInput local_98;
  UnifiedVectorFormat local_80;
  ValidityMask *local_38;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_80.data = (data_ptr_t)&input->validity;
    local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      uVar7 = 0;
      local_80.sel = (SelectionVector *)aggr_input_data;
      local_38 = (ValidityMask *)local_80.data;
      do {
        puVar3 = local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar8 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar8 == (unsigned_long *)0x0) {
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar6 = puVar8[uVar7];
        }
        puVar8 = local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask + 8;
        if (count <= local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask + 8)
        {
          puVar8 = (unsigned_long *)count;
        }
        puVar4 = puVar8;
        if (uVar6 != 0) {
          if (uVar6 == 0xffffffffffffffff) {
            for (; puVar4 = local_80.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask,
                local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask < puVar8;
                local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     ((long)local_80.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask + 1)) {
              MinMaxBase::Operation<double,duckdb::MinMaxState<double>,duckdb::MinOperation>
                        ((MinMaxState<double> *)state,
                         (double *)
                         (pdVar1 + (long)local_80.validity.
                                         super_TemplatedValidityMask<unsigned_long>.validity_mask *
                                   8),(AggregateUnaryInput *)&local_80);
            }
          }
          else {
            for (; puVar4 = local_80.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask,
                local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask < puVar8;
                local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     ((long)local_80.validity.super_TemplatedValidityMask<unsigned_long>.
                            validity_mask + 1)) {
              if ((uVar6 >> ((ulong)(uint)((int)local_80.validity.
                                                super_TemplatedValidityMask<unsigned_long>.
                                                validity_mask - (int)puVar3) & 0x3f) & 1) != 0) {
                MinMaxBase::Operation<double,duckdb::MinMaxState<double>,duckdb::MinOperation>
                          ((MinMaxState<double> *)state,
                           (double *)
                           (pdVar1 + (long)local_80.validity.
                                           super_TemplatedValidityMask<unsigned_long>.validity_mask
                                     * 8),(AggregateUnaryInput *)&local_80);
              }
            }
          }
        }
        local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
        uVar7 = uVar7 + 1;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar8 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
      local_80.sel = *(SelectionVector **)input->data;
      if (state[8] == '\0') {
        *(SelectionVector **)state = local_80.sel;
        state[8] = '\x01';
      }
      else {
        bVar5 = GreaterThan::Operation<double>((double *)state,(double *)&local_80);
        if (bVar5) {
          *(SelectionVector **)state = local_80.sel;
        }
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_80);
    Vector::ToUnifiedFormat(input,count,&local_80);
    local_98.input_mask = &local_80.validity;
    local_98.input_idx = 0;
    local_98.input = aggr_input_data;
    if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar2 = (local_80.sel)->sel_vector;
        uVar7 = 0;
        do {
          local_98.input_idx = uVar7;
          if (psVar2 != (sel_t *)0x0) {
            local_98.input_idx = (idx_t)psVar2[uVar7];
          }
          MinMaxBase::Operation<double,duckdb::MinMaxState<double>,duckdb::MinOperation>
                    ((MinMaxState<double> *)state,(double *)(local_80.data + local_98.input_idx * 8)
                     ,&local_98);
          uVar7 = uVar7 + 1;
        } while (count != uVar7);
      }
    }
    else if (count != 0) {
      psVar2 = (local_80.sel)->sel_vector;
      uVar7 = 0;
      do {
        local_98.input_idx = uVar7;
        if (psVar2 != (sel_t *)0x0) {
          local_98.input_idx = (idx_t)psVar2[uVar7];
        }
        if ((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [local_98.input_idx >> 6] >> (local_98.input_idx & 0x3f) & 1) != 0)) {
          MinMaxBase::Operation<double,duckdb::MinMaxState<double>,duckdb::MinOperation>
                    ((MinMaxState<double> *)state,(double *)(local_80.data + local_98.input_idx * 8)
                     ,&local_98);
        }
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
    }
    if (local_80.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}